

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t is_LargeInode(char *file)

{
  int iVar1;
  int64_t ino;
  stat st;
  char *file_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)file;
  iVar1 = stat(file,(stat *)&ino);
  if (iVar1 < 0) {
    file_local._4_4_ = L'\0';
  }
  else {
    file_local._4_4_ = (wchar_t)(0xffffffff < (long)st.st_dev);
  }
  return file_local._4_4_;
}

Assistant:

int
is_LargeInode(const char *file)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	BY_HANDLE_FILE_INFORMATION bhfi;
	int r;

	r = my_GetFileInformationByName(file, &bhfi);
	if (r != 0)
		return (0);
	return (bhfi.nFileIndexHigh & 0x0000FFFFUL);
#else
	struct stat st;
	int64_t ino;

	if (stat(file, &st) < 0)
		return (0);
	ino = (int64_t)st.st_ino;
	return (ino > 0xffffffff);
#endif
}